

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O1

void __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::push
          (generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
           *this,node_sptr_t *n,zg_t *ts,graph_t *graph,stats_t *stats)

{
  bool bVar1;
  uint *puVar2;
  bool *pbVar3;
  unsigned_long *puVar4;
  uint uVar5;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  local_90;
  undefined1 local_88 [8];
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  local_80;
  
  uVar5 = this->_count + 1;
  this->_count = uVar5;
  if ((node_t *)n->_t != (node_t *)0x0) {
    puVar2 = couvscc::node_t::dfsnum((node_t *)n->_t);
    *puVar2 = uVar5;
    if ((node_t *)n->_t != (node_t *)0x0) {
      pbVar3 = couvscc::node_t::current((node_t *)n->_t);
      *pbVar3 = true;
      local_88 = (undefined1  [8])0x0;
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::reset((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
               *)local_88,n->_t);
      expand_node(&local_80,this,n,ts,graph,stats);
      std::
      deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>>
      ::
      emplace_back<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>
                ((deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>>
                  *)&this->_todo,(todo_stack_entry_t *)local_88);
      std::
      deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
      ::~deque(&local_80);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                  *)local_88);
      local_88 = (undefined1  [8])0x0;
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::reset((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
               *)local_88,n->_t);
      if (n->_t != (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                    *)0x0) {
        local_90._t = (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0;
        intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::reset(&local_90,
                (n->_t->
                super_node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                ).super_node_t.super_node_zg_state_t._state._t);
        zg::zg_t::labels((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,
                         ts,&local_90);
        std::
        deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
        ::
        emplace_back<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>
                  ((deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
                    *)&this->_roots,(roots_stack_entry_t *)local_88);
        bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_80);
        if (bVar1) {
          if (local_80.
              super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
            operator_delete(local_80.
                            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map,
                            (long)local_80.
                                  super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_80.
                                  super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map);
          }
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t
                    ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                      *)local_88);
          intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&local_90);
          std::
          deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::push_back(&(this->_active).c,n);
          puVar4 = stats_t::visited_states(stats);
          *puVar4 = *puVar4 + 1;
          return;
        }
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
               );
}

Assistant:

void push(node_sptr_t & n, TS & ts, GRAPH & graph, tchecker::algorithms::couvscc::stats_t & stats)
  {
    ++_count;
    n->dfsnum() = _count;
    n->current() = true;
    _todo.push(todo_stack_entry_t{n, expand_node(n, ts, graph, stats)});
    _roots.push(roots_stack_entry_t{n, ts.labels(n->state_ptr())});
    _active.push(n);
    ++stats.visited_states();
  }